

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.h
# Opt level: O1

void __thiscall
wallet::SelectionResult::
InsertInputs<std::set<std::shared_ptr<wallet::COutput>,std::less<std::shared_ptr<wallet::COutput>>,std::allocator<std::shared_ptr<wallet::COutput>>>>
          (SelectionResult *this,
          set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          *inputs)

{
  size_t sVar1;
  size_t sVar2;
  string_view func;
  runtime_error *this_00;
  long in_FS_OFFSET;
  string_view msg;
  string_view file;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = (inputs->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  sVar2 = (this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,std::shared_ptr<wallet::COutput>,std::_Identity<std::shared_ptr<wallet::COutput>>,std::less<std::shared_ptr<wallet::COutput>>,std::allocator<std::shared_ptr<wallet::COutput>>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>>>
            ((_Rb_tree<std::shared_ptr<wallet::COutput>,std::shared_ptr<wallet::COutput>,std::_Identity<std::shared_ptr<wallet::COutput>>,std::less<std::shared_ptr<wallet::COutput>>,std::allocator<std::shared_ptr<wallet::COutput>>>
              *)this,(inputs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_>)
             &(inputs->_M_t)._M_impl.super__Rb_tree_header);
  if ((this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header._M_node_count == sVar1 + sVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    func._M_str = "InsertInputs";
    func._M_len = 0xc;
    msg._M_str = "Shared UTXOs among selection results";
    msg._M_len = 0x24;
    file._M_str = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.h"
    ;
    file._M_len = 0x5f;
    StrFormatInternalBug_abi_cxx11_(&local_40,msg,file,0x161,func);
    std::runtime_error::runtime_error(this_00,(string *)&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void InsertInputs(const T& inputs)
    {
        // Store sum of combined input sets to check that the results have no shared UTXOs
        const size_t expected_count = m_selected_inputs.size() + inputs.size();
        util::insert(m_selected_inputs, inputs);
        if (m_selected_inputs.size() != expected_count) {
            throw std::runtime_error(STR_INTERNAL_BUG("Shared UTXOs among selection results"));
        }
    }